

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

_Bool Curl_sasl_can_authenticate(SASL *sasl,connectdata *conn)

{
  _Bool _Var1;
  
  _Var1 = true;
  if (((conn->bits).field_0x5 & 1) == 0) {
    _Var1 = SUB41((sasl->authmechs & sasl->prefmech & 0x20) >> 5,0);
  }
  return _Var1;
}

Assistant:

bool Curl_sasl_can_authenticate(struct SASL *sasl, struct connectdata *conn)
{
  /* Have credentials been provided? */
  if(conn->bits.user_passwd)
    return TRUE;

  /* EXTERNAL can authenticate without a user name and/or password */
  if(sasl->authmechs & sasl->prefmech & SASL_MECH_EXTERNAL)
    return TRUE;

  return FALSE;
}